

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jzon.cpp
# Opt level: O2

int __thiscall Jzon::Node::remove(Node *this,char *__filename)

{
  Data *pDVar1;
  __type _Var2;
  Data *extraout_RAX;
  undefined7 extraout_var;
  iterator iVar4;
  const_iterator __position;
  Data *pDVar3;
  
  pDVar3 = this->data;
  if ((pDVar3 != (Data *)0x0) && (pDVar3->type == T_OBJECT)) {
    detach(this);
    pDVar1 = this->data;
    pDVar3 = extraout_RAX;
    for (__position._M_current =
              (pDVar1->children).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        __position._M_current !=
        (pDVar1->children).
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
        __position._M_current = __position._M_current + 1) {
      _Var2 = std::operator==(&(__position._M_current)->first,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __filename);
      pDVar3 = (Data *)CONCAT71(extraout_var,_Var2);
      if (_Var2) {
        iVar4 = std::
                vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Jzon::Node>_>_>
                ::erase(&pDVar1->children,__position);
        return (int)iVar4._M_current;
      }
    }
  }
  return (int)pDVar3;
}

Assistant:

void Node::remove(const std::string &name)
	{
		if (isObject())
		{
			detach();
			NamedNodeList &children = data->children;
			for (NamedNodeList::iterator it = children.begin(); it != children.end(); ++it)
			{
				if ((*it).first == name)
				{
					children.erase(it);
					break;
				}
			}
		}
	}